

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O2

int AF_A_LeafCheck(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  double dVar2;
  double dVar3;
  VM_UBYTE VVar4;
  DObject *this;
  bool bVar5;
  int iVar6;
  AActor *pAVar7;
  AActor *pAVar8;
  AActor *this_00;
  char *__assertion;
  DAngle local_30;
  DAngle local_28;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053e520;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_0053e330:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar5 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar5) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053e520;
        }
      }
      if (numparam == 1) goto LAB_0053e3b0;
      VVar4 = param[1].field_0.field_3.Type;
      if (VVar4 != 0xff) {
        if (VVar4 != '\x03') goto LAB_0053e510;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar5 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar5) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053e520;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053e510;
      }
      if ((((uint)numparam < 3) || (VVar4 = param[2].field_0.field_3.Type, VVar4 == 0xff)) ||
         ((VVar4 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053e3b0:
        iVar6 = this_00->special1;
        this_00->special1 = iVar6 + 1;
        if (iVar6 < 0x13) {
          pAVar7 = GC::ReadBarrier<AActor>((AActor **)&this_00->target);
          pAVar8 = this_00;
          if (pAVar7 != (AActor *)0x0) {
            pAVar8 = GC::ReadBarrier<AActor>((AActor **)&this_00->target);
          }
          dVar2 = (pAVar8->Angles).Yaw.Degrees;
          iVar6 = FRandom::operator()(&pr_leafcheck);
          if (iVar6 < 0x41) {
            AActor::SetState(this_00,this_00->SpawnState + 7,false);
            iVar6 = FRandom::operator()(&pr_leafcheck);
            (this_00->Vel).Z = (double)iVar6 * 0.0078125 + 1.0;
            local_30.Degrees = dVar2;
            iVar6 = FRandom::operator()(&pr_leafcheck);
            AActor::Thrust(this_00,&local_30,(double)iVar6 * 0.0078125 + 2.0);
            pbVar1 = (byte *)((long)&(this_00->flags).Value + 2);
            *pbVar1 = *pbVar1 | 1;
          }
          else {
            dVar3 = (this_00->Vel).X;
            if ((((dVar3 == 0.0) && (!NAN(dVar3))) && (dVar3 = (this_00->Vel).Y, dVar3 == 0.0)) &&
               (!NAN(dVar3))) {
              local_28.Degrees = dVar2;
              iVar6 = FRandom::operator()(&pr_leafcheck);
              AActor::Thrust(this_00,&local_28,(double)iVar6 * 0.0078125 + 1.0);
            }
          }
        }
        else {
          AActor::SetState(this_00,(FState *)0x0,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053e520;
    }
    if (this_00 == (AActor *)0x0) goto LAB_0053e330;
  }
LAB_0053e510:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053e520:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0x102,"int AF_A_LeafCheck(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LeafCheck)
{
	PARAM_ACTION_PROLOGUE;

	self->special1++;
	if (self->special1 >= 20)
	{
		self->SetState (NULL);
		return 0;
	}
	DAngle ang = self->target ? self->target->Angles.Yaw : self->Angles.Yaw;
	if (pr_leafcheck() > 64)
	{
		if (self->Vel.X == 0 && self->Vel.Y == 0)
		{
			self->Thrust(ang, pr_leafcheck() / 128. + 1);
		}
		return 0;
	}
	self->SetState (self->SpawnState + 7);
	self->Vel.Z = pr_leafcheck() / 128. + 1;
	self->Thrust(ang, pr_leafcheck() / 128. + 2);
	self->flags |= MF_MISSILE;
	return 0;
}